

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralSurfaceConnection::~IfcStructuralSurfaceConnection
          (IfcStructuralSurfaceConnection *this)

{
  ~IfcStructuralSurfaceConnection
            ((IfcStructuralSurfaceConnection *)
             (&(this->super_IfcStructuralConnection).field_0x0 +
             *(long *)(*(long *)&this->super_IfcStructuralConnection + -0x18)));
  return;
}

Assistant:

IfcStructuralSurfaceConnection() : Object("IfcStructuralSurfaceConnection") {}